

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3OomFault(sqlite3 *db)

{
  Parse *in_RAX;
  
  if (db->mallocFailed != '\0') {
    return in_RAX;
  }
  if (db->bBenignMalloc == '\0') {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    (db->lookaside).sz = 0;
    if (db->pParse != (Parse *)0x0) {
      sqlite3ErrorMsg(db->pParse,"out of memory");
      in_RAX = db->pParse;
      while( true ) {
        in_RAX->rc = 7;
        in_RAX = in_RAX->pOuterParse;
        if (in_RAX == (Parse *)0x0) break;
        in_RAX->nErr = in_RAX->nErr + 1;
      }
    }
  }
  return in_RAX;
}

Assistant:

SQLITE_PRIVATE void *sqlite3OomFault(sqlite3 *db){
  if( db->mallocFailed==0 && db->bBenignMalloc==0 ){
    db->mallocFailed = 1;
    if( db->nVdbeExec>0 ){
      AtomicStore(&db->u1.isInterrupted, 1);
    }
    DisableLookaside;
    if( db->pParse ){
      Parse *pParse;
      sqlite3ErrorMsg(db->pParse, "out of memory");
      db->pParse->rc = SQLITE_NOMEM_BKPT;
      for(pParse=db->pParse->pOuterParse; pParse; pParse = pParse->pOuterParse){
        pParse->nErr++;
        pParse->rc = SQLITE_NOMEM;
      }
    }
  }
  return 0;
}